

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

void parallel_for_2d(thread_pool *thread_pool,_func_void_parallel_task_2d_ptr_size_t *compute,
                    parallel_task_2d *init,size_t task_size,range *range)

{
  work_item *pwVar1;
  size_t count;
  ulong uVar2;
  ulong uVar3;
  work_item *pwVar4;
  work_item *pwVar5;
  work_item *last;
  work_item *last_00;
  work_item *pwVar6;
  work_item *first;
  work_item *pwVar7;
  work_item *pwVar8;
  ulong uVar9;
  work_item *pwVar10;
  work_item *local_50;
  
  count = thread_pool->thread_count;
  uVar2 = count * 2;
  if (uVar2 * task_size != 0) {
    local_50 = (work_item *)malloc(uVar2 * task_size);
    if (local_50 != (work_item *)0x0) goto LAB_001025bd;
    parallel_for_2d_cold_1();
  }
  local_50 = (work_item *)0x0;
LAB_001025bd:
  (init->work_item).work_fn = (work_fn_t)compute;
  (init->work_item).next = (work_item *)0x0;
  pwVar10 = local_50;
  for (uVar9 = uVar2; uVar9 != 0; uVar9 = uVar9 - 1) {
    memcpy(pwVar10,init,task_size);
    if (uVar9 != 1) {
      pwVar10->next = (work_item *)((long)&pwVar10->work_fn + task_size);
    }
    pwVar10 = (work_item *)((long)&pwVar10->work_fn + task_size);
  }
  pwVar10 = (work_item *)range[1].begin;
  uVar9 = range->end - range->begin;
  last = (work_item *)0x0;
  pwVar6 = (work_item *)range[1].end;
  uVar3 = (long)pwVar6 - (long)pwVar10;
  first = local_50;
  if (pwVar10 < pwVar6) {
    last = (work_item *)0x0;
    pwVar5 = local_50;
    do {
      pwVar4 = (work_item *)(((uVar3 / uVar2 + 1) - (ulong)(uVar3 % uVar2 == 0)) + (long)pwVar10);
      if (pwVar4 < pwVar6) {
        pwVar6 = pwVar4;
      }
      pwVar7 = (work_item *)range->end;
      last_00 = pwVar5;
      pwVar8 = (work_item *)range->begin;
      if ((work_item *)range->begin < pwVar7) {
        do {
          if (last_00 == (work_item *)0x0) {
            __assert_fail("current_task",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                          ,0x132,
                          "void parallel_for_2d(struct thread_pool *, void (*)(struct parallel_task_2d *, size_t), struct parallel_task_2d *, size_t, const struct range *)"
                         );
          }
          pwVar1 = (work_item *)((long)pwVar8 + ((uVar9 / uVar2 + 1) - (ulong)(uVar9 % uVar2 == 0)))
          ;
          if (pwVar1 < pwVar7) {
            pwVar7 = pwVar1;
          }
          last_00[1].work_fn = (work_fn_t)pwVar8;
          last_00[1].next = pwVar7;
          last_00[2].work_fn = (work_fn_t)pwVar10;
          last_00[2].next = pwVar6;
          pwVar5 = last_00->next;
          last = last_00;
          if (pwVar5 == (work_item *)0x0) {
            submit_work(thread_pool,first,last_00);
            pwVar5 = wait_for_completion(thread_pool,count);
            last = (work_item *)0x0;
            first = pwVar5;
          }
          pwVar7 = (work_item *)range->end;
          last_00 = pwVar5;
          pwVar8 = pwVar1;
        } while (pwVar1 < pwVar7);
      }
      pwVar6 = (work_item *)range[1].end;
      pwVar10 = pwVar4;
    } while (pwVar4 < pwVar6);
  }
  if (last != (work_item *)0x0) {
    last->next = (work_item *)0x0;
    submit_work(thread_pool,first,last);
  }
  wait_for_completion(thread_pool,0);
  free(local_50);
  return;
}

Assistant:

void parallel_for_2d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_2d*, size_t),
    struct parallel_task_2d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size[] = {
        compute_chunk_size(range[0].end - range[0].begin, task_count),
        compute_chunk_size(range[1].end - range[1].begin, task_count)
    };
    for (size_t j = range[1].begin; j < range[1].end; j += chunk_size[1]) {
        size_t next_j = range_end(j, chunk_size[1], range[1].end);
        for (size_t i = range[0].begin; i < range[0].end; i += chunk_size[0]) {
            size_t next_i = range_end(i, chunk_size[0], range[0].end);
            assert(current_task);
            ((struct parallel_task_2d*)current_task)->range[0].begin = i;
            ((struct parallel_task_2d*)current_task)->range[0].end   = next_i;
            ((struct parallel_task_2d*)current_task)->range[1].begin = j;
            ((struct parallel_task_2d*)current_task)->range[1].end   = next_j;
            previous_task = current_task;
            current_task = current_task->next;
            if (!current_task) {
                submit_work(thread_pool, first_task, previous_task);
                first_task = current_task = wait_for_completion(thread_pool, thread_count);
                previous_task = NULL;
            }
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}